

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O1

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::elementEnd(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
             *this,ParserChar *elementName)

{
  ElementDataStack *this_00;
  size_t *psVar1;
  IUnknownElementHandler *pIVar2;
  ulong uVar3;
  void *pvVar4;
  undefined1 uVar5;
  char cVar6;
  int iVar7;
  _Elt_pointer pNVar8;
  _Elt_pointer pEVar9;
  _Base_ptr p_Var10;
  ElementFunctionMap *pEVar11;
  _Rb_tree_header *p_Var12;
  _Base_ptr p_Var13;
  StringHashPair hashPair;
  StringHashPair local_38;
  
  pNVar8 = (this->mNamespacesStack).c.
           super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pNVar8 != (this->mNamespacesStack).c.
                super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pNVar8 == (this->mNamespacesStack).c.
                  super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar1 = &(this->mNamespacesStack).c.
                super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1][8].counter;
      *psVar1 = *psVar1 - 1;
      pNVar8 = (this->mNamespacesStack).c.
               super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    else {
      pNVar8[-1].counter = pNVar8[-1].counter - 1;
    }
    if (pNVar8[-1].counter == 0) {
      std::
      deque<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
      ::pop_back(&(this->mNamespacesStack).c);
    }
  }
  if (this->mIgnoreElements == 0) {
    if (this->mUnknownElements == 0) {
      if (this->mNamespaceElements != 0) {
        this->mNamespaceElements = this->mNamespaceElements - 1;
        local_38 = Utils::calculateStringHashWithNamespace(elementName);
        uVar5 = (**(code **)(*(long *)this->mActiveNamespaceHandler + 0x18))
                          (this->mActiveNamespaceHandler,&local_38.second,elementName);
        return (bool)uVar5;
      }
      pEVar9 = (this->super_ParserTemplateBase).mElementDataStack.
               super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pEVar9 != (this->super_ParserTemplateBase).mElementDataStack.
                    super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        if (pEVar9 == (this->super_ParserTemplateBase).mElementDataStack.
                      super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pEVar9 = (this->super_ParserTemplateBase).mElementDataStack.
                   super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        uVar3 = pEVar9[-1].generatedElementHash;
        pEVar11 = &this->mElementFunctionMap;
        if (this->mCurrentElementFunctionMap != (ElementFunctionMap *)0x0) {
          pEVar11 = this->mCurrentElementFunctionMap;
        }
        p_Var12 = &(pEVar11->_M_t)._M_impl.super__Rb_tree_header;
        p_Var13 = (pEVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var12->_M_header;
        for (; p_Var13 != (_Base_ptr)0x0;
            p_Var13 = (&p_Var13->_M_left)[*(ulong *)(p_Var13 + 1) < uVar3]) {
          if (*(ulong *)(p_Var13 + 1) >= uVar3) {
            p_Var10 = p_Var13;
          }
        }
        p_Var13 = &p_Var12->_M_header;
        if (((_Rb_tree_header *)p_Var10 != p_Var12) &&
           (p_Var13 = p_Var10, uVar3 < *(ulong *)(p_Var10 + 1))) {
          p_Var13 = &p_Var12->_M_header;
        }
        this_00 = &(this->super_ParserTemplateBase).mElementDataStack;
        if (((_Rb_tree_header *)p_Var13 != p_Var12) &&
           (p_Var10 = p_Var13[3]._M_parent, p_Var10 != (_Base_ptr)0x0)) {
          if (((ulong)p_Var10 & 1) != 0) {
            p_Var10 = *(_Base_ptr *)
                       (*(long *)((long)&(p_Var13[3]._M_left)->_M_color + (long)this) + -1 +
                       (long)p_Var10);
          }
          pvVar4 = pEVar9[-1].validationData;
          cVar6 = (*(code *)p_Var10)();
          if (cVar6 != '\0') {
            std::
            deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
            ::pop_back(this_00);
            p_Var10 = p_Var13[2]._M_parent;
            if (p_Var10 == (_Base_ptr)0x0) {
              return false;
            }
            if (((ulong)p_Var10 & 1) != 0) {
              p_Var10 = *(_Base_ptr *)
                         (*(long *)((long)&(p_Var13[2]._M_left)->_M_color + (long)this) + -1 +
                         (long)p_Var10);
            }
            cVar6 = (*(code *)p_Var10)();
            if (cVar6 == '\0') {
              return false;
            }
            if (pvVar4 != (void *)0x0) {
              StackMemoryManager::deleteObject
                        (&(this->super_ParserTemplateBase).mStackMemoryManager);
              return true;
            }
            return true;
          }
        }
        std::
        deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
        ::pop_back(this_00);
      }
      return false;
    }
    this->mUnknownElements = this->mUnknownElements - 1;
    pIVar2 = this->mUnknownHandler;
    if (pIVar2 != (IUnknownElementHandler *)0x0) {
      iVar7 = (*pIVar2->_vptr_IUnknownElementHandler[3])(pIVar2,elementName);
      return SUB41(iVar7,0);
    }
  }
  else {
    this->mIgnoreElements = this->mIgnoreElements - 1;
  }
  return true;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::elementEnd(const ParserChar* elementName)
	{
        if ( !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter--;
            if ( mNamespacesStack.top().counter == 0 )
            {
                mNamespacesStack.pop();
            }
        }
        if ( mIgnoreElements > 0 )
        {
            mIgnoreElements--;
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            mUnknownElements--;
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->elementEnd( elementName );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            mNamespaceElements--;
            StringHashPair hashPair = Utils::calculateStringHashWithNamespace( elementName );
            return mActiveNamespaceHandler->elementEnd( hashPair.second, elementName );
        }

        if ( mElementDataStack.empty() )
            return false;
        ElementData elementData = mElementDataStack.back();

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
        typename ElementFunctionMap::const_iterator it = functionMapToUse->find(elementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
        {
            mElementDataStack.pop_back();
			return false;
        }
		const FunctionStruct& functions = it->second;

		if ( !functions.validateEndFunction || !(static_cast<DerivedClass*>(this)->*functions.validateEndFunction)())
        {
            mElementDataStack.pop_back();
			return false;
        }

        mElementDataStack.pop_back();

        if ( !functions.endFunction || !(static_cast<DerivedClass*>(this)->*functions.endFunction)() )
			return false;

		if ( elementData.validationData )
			mStackMemoryManager.deleteObject(); // validation data

		return true;
	}